

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O3

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPositionError
          (ContactConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *errSysUpd,
          ConstraintCache *cache,bool updateKinematics)

{
  uint uVar1;
  _Bit_type *p_Var2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  Vector3d local_38;
  
  CalcBodyToBaseCoordinates
            (&local_38,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  dVar7 = (this->groundPoint).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(double *)(cache + 0x50) =
       local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0] -
       (this->groundPoint).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  *(double *)(cache + 0x58) =
       local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1] - dVar7;
  *(double *)(cache + 0x60) =
       local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2] -
       (this->groundPoint).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  uVar4 = (ulong)(this->super_Constraint).sizeOfConstraint;
  if (uVar4 != 0) {
    p_Var2 = (this->super_Constraint).positionConstraint.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar1 = (this->super_Constraint).rowInSystem;
    pdVar3 = (errSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar5 = (double *)(*(long *)&(this->super_Constraint).field_0xd8 + 0x10);
    uVar6 = 0;
    do {
      if ((p_Var2[uVar6 >> 6 & 0x3ffffff] >> (uVar6 & 0x3f) & 1) == 0) {
        dVar7 = 0.0;
      }
      else {
        dVar7 = *(double *)(cache + 0x60) * *pdVar5 +
                pdVar5[-1] * *(double *)(cache + 0x58) + pdVar5[-2] * *(double *)(cache + 0x50);
      }
      pdVar3[uVar1 + (int)uVar6] = dVar7;
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + 3;
    } while (uVar4 != uVar6);
  }
  return;
}

Assistant:

void ContactConstraint::calcPositionError(Model &model,
                                                      const double time,
                                                      const Math::VectorNd &Q,
                                                      Math::VectorNd &errSysUpd,
                                                      ConstraintCache &cache,
                                                      bool updateKinematics)
{
  cache.vec3A = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics)  - groundPoint;
  for(unsigned int i = 0; i < sizeOfConstraint; ++i){
    if(positionConstraint[i]){
      errSysUpd[rowInSystem+i] = cache.vec3A.dot( T[i] );
    }else{
      errSysUpd[rowInSystem+i] = 0.;
    }
  }
}